

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::OstreamView
          (OstreamView *this,LogMessageData *message_data)

{
  Span<char> *pSVar1;
  size_type sVar2;
  pointer pcVar3;
  Span<char> SVar4;
  LogMessageData *message_data_local;
  OstreamView *this_local;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__OstreamView_0082dd40;
  this->data_ = message_data;
  pSVar1 = LogMessageData::encoded_remaining(this->data_);
  Span<char>::Span<absl::lts_20250127::Span<char>,_void,_absl::lts_20250127::Span<char>,_0>
            (&this->encoded_remaining_copy_,pSVar1);
  Span<char>::Span(&this->message_start_);
  Span<char>::Span(&this->string_start_);
  sVar2 = Span<char>::size(&this->encoded_remaining_copy_);
  SVar4 = EncodeMessageStart(7,sVar2,&this->encoded_remaining_copy_);
  this->message_start_ = SVar4;
  sVar2 = Span<char>::size(&this->encoded_remaining_copy_);
  SVar4 = EncodeMessageStart(1,sVar2,&this->encoded_remaining_copy_);
  this->string_start_ = SVar4;
  pSVar1 = &this->encoded_remaining_copy_;
  pcVar3 = Span<char>::data(pSVar1);
  Span<char>::data(pSVar1);
  Span<char>::size(pSVar1);
  std::streambuf::setp((char *)this,pcVar3);
  std::ios::rdbuf((streambuf *)
                  (&this->data_->manipulated + *(long *)(*(long *)&this->data_->manipulated + -0x18)
                  ));
  return;
}

Assistant:

LogMessage::OstreamView::OstreamView(LogMessageData& message_data)
    : data_(message_data), encoded_remaining_copy_(data_.encoded_remaining()) {
  // This constructor sets the `streambuf` up so that streaming into an attached
  // ostream encodes string data in-place.  To do that, we write appropriate
  // headers into the buffer using a copy of the buffer view so that we can
  // decide not to keep them later if nothing is ever streamed in.  We don't
  // know how much data we'll get, but we can use the size of the remaining
  // buffer as an upper bound and fill in the right size once we know it.
  message_start_ =
      EncodeMessageStart(EventTag::kValue, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  string_start_ =
      EncodeMessageStart(ValueTag::kString, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  setp(encoded_remaining_copy_.data(),
       encoded_remaining_copy_.data() + encoded_remaining_copy_.size());
  data_.manipulated.rdbuf(this);
}